

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O2

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::FoldConditionBlock
          (LoopUnrollerUtilsImpl *this,BasicBlock *condition_block,uint32_t operand_label)

{
  uint32_t label_id;
  Instruction *this_00;
  DebugScope scope;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> lines;
  InstructionBuilder builder;
  
  BasicBlock::tail((BasicBlock *)&builder);
  label_id = Instruction::GetSingleWordOperand((Instruction *)builder.context_,1);
  scope = (DebugScope)
          ((builder.context_)->feature_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
          .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
            (&lines,(vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                     *)&((builder.context_)->consumer_)._M_invoker);
  IRContext::KillInst(this->context_,(Instruction *)builder.context_);
  InstructionBuilder::InstructionBuilder
            (&builder,this->context_,condition_block,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  this_00 = InstructionBuilder::AddBranch(&builder,label_id);
  if (lines.
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      lines.
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    Instruction::AddDebugLine
              (this_00,lines.
                       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
  }
  Instruction::SetDebugScope(this_00,&scope);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::~vector
            (&lines);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::FoldConditionBlock(BasicBlock* condition_block,
                                               uint32_t operand_label) {
  // Remove the old conditional branch to the merge and continue blocks.
  Instruction& old_branch = *condition_block->tail();
  uint32_t new_target = old_branch.GetSingleWordOperand(operand_label);

  DebugScope scope = old_branch.GetDebugScope();
  const std::vector<Instruction> lines = old_branch.dbg_line_insts();

  context_->KillInst(&old_branch);
  // Add the new unconditional branch to the merge block.
  InstructionBuilder builder(
      context_, condition_block,
      IRContext::Analysis::kAnalysisDefUse |
          IRContext::Analysis::kAnalysisInstrToBlockMapping);
  Instruction* new_branch = builder.AddBranch(new_target);

  if (!lines.empty()) new_branch->AddDebugLine(&lines.back());
  new_branch->SetDebugScope(scope);
}